

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O1

void test_fuzz(files *filesets)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  files *pfVar5;
  int iVar6;
  wchar_t wVar7;
  int iVar8;
  char *pcVar9;
  archive_conflict *a;
  char *__ptr;
  void *pvVar10;
  time_t tVar11;
  FILE *__s;
  size_t v2;
  archive *paVar12;
  uint uVar13;
  char ***pppcVar14;
  ulong uVar15;
  long lVar16;
  char **names;
  void *__ptr_00;
  size_t size;
  archive_entry *ae;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  char *local_78;
  void *local_70;
  char ***local_68;
  archive_entry *local_60;
  files *local_58;
  long local_50;
  la_int64_t local_48;
  size_t local_40;
  void *local_38;
  
  pcVar9 = getenv("SKIP_TEST_FUZZ");
  if (pcVar9 != (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                   ,L'@');
    test_skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ environment variable");
    return;
  }
  names = filesets->names;
  if (names != (char **)0x0) {
    pppcVar14 = &filesets->names;
    lVar16 = 0;
    local_58 = filesets;
    do {
      pfVar5 = local_58;
      local_78 = (char *)0x0;
      local_50 = lVar16;
      extract_reference_files(names);
      if (pfVar5[lVar16].uncompress == 0) {
        if (**pppcVar14 == (char *)0x0) {
          pvVar10 = (void *)0x0;
        }
        else {
          lVar16 = 8;
          pcVar9 = (char *)0x0;
          __ptr_00 = (void *)0x0;
          local_68 = pppcVar14;
          do {
            __ptr = slurpfile((size_t *)&local_78,"%s");
            pvVar10 = realloc(__ptr_00,(size_t)(local_78 + (long)pcVar9));
            wVar7 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                     ,L'|',(uint)(pvVar10 != (void *)0x0),"newraw != NULL",
                                     (void *)0x0);
            pcVar4 = local_78;
            if (wVar7 == L'\0') {
              free(__ptr);
              local_78 = (char *)0x0;
              pvVar10 = __ptr_00;
              break;
            }
            memcpy((char *)((long)pvVar10 + (long)pcVar9),__ptr,(size_t)local_78);
            pcVar9 = pcVar9 + (long)pcVar4;
            local_78 = pcVar9;
            free(__ptr);
            plVar1 = (long *)((long)*local_68 + lVar16);
            lVar16 = lVar16 + 8;
            __ptr_00 = pvVar10;
          } while (*plVar1 != 0);
        }
LAB_00144c4b:
        if (local_78 == (char *)0x0) {
          bVar3 = false;
        }
        else {
          local_70 = pvVar10;
          pvVar10 = malloc((size_t)local_78);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\x8f',(uint)(pvVar10 != (void *)0x0),"image != NULL",(void *)0x0);
          if (pvVar10 == (void *)0x0) {
            bVar3 = true;
            pvVar10 = local_70;
          }
          else {
            pppcVar14 = (char ***)0x0;
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'\x96',(uint)(local_70 != (void *)0x0),"rawimage != NULL",(void *)0x0
                            );
            tVar11 = time((time_t *)0x0);
            srand((uint)tVar11);
            do {
              pcVar9 = local_78;
              local_68 = pppcVar14;
              memcpy(pvVar10,local_70,(size_t)local_78);
              iVar6 = (int)pcVar9 / 100;
              if (iVar6 < 5) {
                iVar6 = 4;
              }
              iVar8 = rand();
              if (0 < (int)((long)iVar8 % (long)iVar6)) {
                uVar15 = (long)iVar8 % (long)iVar6 & 0xffffffff;
                do {
                  iVar6 = rand();
                  iVar8 = rand();
                  *(char *)((long)pvVar10 + (ulong)(long)iVar8 % (ulong)local_78) = (char)iVar6;
                  uVar13 = (int)uVar15 - 1;
                  uVar15 = (ulong)uVar13;
                } while (uVar13 != 0);
              }
              iVar6 = 3;
              do {
                __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                            ,"wb");
                if (__s != (FILE *)0x0) goto LAB_00144d5a;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
              __s = (FILE *)0x0;
LAB_00144d5a:
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                               ,L'·',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
              pcVar9 = local_78;
              v2 = fwrite(pvVar10,1,(size_t)local_78,__s);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'¸',(longlong)pcVar9,"(size_t)size",v2,
                                  "fwrite(image, 1, (size_t)size, f)",(void *)0x0);
              fclose(__s);
              paVar12 = archive_read_new();
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                               ,L'¼',(uint)(paVar12 != (archive *)0x0),
                               "(a = archive_read_new()) != NULL",(void *)0x0);
              iVar6 = archive_read_support_filter_all(paVar12);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'¾',0,"ARCHIVE_OK",(long)iVar6,
                                  "archive_read_support_filter_all(a)",paVar12);
              iVar6 = archive_read_support_format_all(paVar12);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'À',0,"ARCHIVE_OK",(long)iVar6,
                                  "archive_read_support_format_all(a)",paVar12);
              iVar6 = archive_read_open_memory(paVar12,pvVar10,(size_t)local_78);
              if (iVar6 == 0) {
                iVar6 = archive_read_next_header(paVar12,&local_60);
                while (iVar6 == 0) {
                  do {
                    iVar6 = archive_read_data_block(paVar12,&local_38,&local_40,&local_48);
                  } while (iVar6 == 0);
                  iVar6 = archive_read_next_header(paVar12,&local_60);
                }
                archive_read_close(paVar12);
              }
              archive_read_free(paVar12);
              paVar12 = archive_read_new();
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                               ,L'Í',(uint)(paVar12 != (archive *)0x0),
                               "(a = archive_read_new()) != NULL",(void *)0x0);
              iVar6 = archive_read_support_filter_all(paVar12);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'Ï',0,"ARCHIVE_OK",(long)iVar6,
                                  "archive_read_support_filter_all(a)",paVar12);
              iVar6 = archive_read_support_format_all(paVar12);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'Ñ',0,"ARCHIVE_OK",(long)iVar6,
                                  "archive_read_support_format_all(a)",paVar12);
              iVar8 = archive_read_open_memory(paVar12,pvVar10,(size_t)local_78);
              iVar6 = (int)local_68;
              if (iVar8 == 0) {
                do {
                  iVar6 = archive_read_next_header(paVar12,&local_60);
                } while (iVar6 == 0);
                archive_read_close(paVar12);
                iVar6 = (int)local_68;
              }
              archive_read_free(paVar12);
              pppcVar14 = (char ***)(ulong)(iVar6 + 1U);
            } while (iVar6 + 1U != 1000);
            free(pvVar10);
            bVar3 = false;
            pvVar10 = local_70;
          }
        }
        free(pvVar10);
      }
      else {
        a = (archive_conflict *)archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'Q',(uint)(a != (archive_conflict *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar6 = archive_read_support_filter_all((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'S',0,"ARCHIVE_OK",(long)iVar6,"archive_read_support_filter_all(a)",a)
        ;
        iVar6 = archive_read_support_format_raw((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'U',0,"ARCHIVE_OK",(long)iVar6,"archive_read_support_format_raw(a)",a)
        ;
        wVar7 = archive_read_open_filenames(a,*pppcVar14,0x4000);
        if (wVar7 == L'\0') {
          iVar6 = archive_read_next_header((archive *)a,&local_60);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'a',0,"ARCHIVE_OK",(long)iVar6,"archive_read_next_header(a, &ae)",a)
          ;
          pvVar10 = malloc(30000000);
          local_78 = (char *)archive_read_data((archive *)a,pvVar10,30000000);
          iVar6 = archive_read_next_header((archive *)a,&local_60);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'e',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header(a, &ae)",a
                             );
          iVar6 = archive_read_free((archive *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'g',0,"ARCHIVE_OK",(long)iVar6,"archive_read_free(a)",(void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'h',(uint)(local_78 != (char *)0x0),"size > 0",(void *)0x0);
          if ((**pppcVar14 == (char *)0x0) || ((*pppcVar14)[1] == (char *)0x0)) {
            failure("Internal buffer is not big enough for uncompressed test files");
          }
          else {
            failure("Internal buffer is not big enough for uncompressed test file: %s");
          }
          wVar7 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'p',(uint)(local_78 < buff3 + 0x55a690),"size < buffsize",
                                   (void *)0x0);
          bVar2 = true;
          if (wVar7 == L'\0') {
            free(pvVar10);
            goto LAB_00144afe;
          }
        }
        else {
          archive_read_free((archive *)a);
          if ((**pppcVar14 == (char *)0x0) || ((*pppcVar14)[1] == (char *)0x0)) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'Z');
            test_skipping("Cannot uncompress fileset");
          }
          else {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\\');
            test_skipping("Cannot uncompress %s",**pppcVar14);
          }
LAB_00144afe:
          pvVar10 = (void *)0x0;
          bVar2 = false;
        }
        bVar3 = false;
        if (bVar2) goto LAB_00144c4b;
      }
      if (bVar3) {
        return;
      }
      lVar16 = local_50 + 1;
      pppcVar14 = &local_58[lVar16].names;
      names = *pppcVar14;
    } while (names != (char **)0x0);
  }
  return;
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;
	const char *skip_fuzz_tests;

	skip_fuzz_tests = getenv("SKIP_TEST_FUZZ");
	if (skip_fuzz_tests != NULL) {
		skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ "
		    "environment variable");
		return;
	}

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				rawimage = NULL;
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				char *newraw;
				tmp = slurpfile(&size, "%s",
						filesets[n].names[i]);
				newraw = realloc(rawimage, oldsize + size);
				if (!assert(newraw != NULL))
				{
					free(tmp);
					size = 0;
					break;
				}
				rawimage = newraw;
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
			}
		}
		if (size == 0) {
			free(rawimage);
			rawimage = NULL;
			continue;
		}
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL) {
			free(rawimage);
			rawimage = NULL;
			return;
		}

		assert(rawimage != NULL);

		srand((unsigned)time(NULL));

		for (i = 0; i < 1000; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (q < 4)
				q = 4;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assert(f != NULL);
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			// Try to read all headers and bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);

			// Just list headers, skip bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}